

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

lbool __thiscall Gluco::Solver::solve_(Solver *this)

{
  _func_int_void_ptr_int_int_ptr *p_Var1;
  lbool *plVar2;
  lbool lVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  rusage *__usage;
  double dVar9;
  double dVar10;
  rusage ru;
  rusage local_b8;
  
  if ((this->incremental != 0) && (this->certifiedUNSAT == true)) {
    puts("Can not use incremental and certified unsat in the same time");
    exit(-1);
  }
  if ((this->model).data != (lbool *)0x0) {
    (this->model).sz = 0;
  }
  if ((this->conflict).data != (Lit *)0x0) {
    (this->conflict).sz = 0;
  }
  if (this->ok != true) {
    return (lbool)'\x01';
  }
  __usage = &local_b8;
  getrusage(RUSAGE_SELF,__usage);
  dVar9 = (double)local_b8.ru_utime.tv_sec;
  dVar10 = (double)local_b8.ru_utime.tv_usec;
  this->solves = this->solves + 1;
  if ((this->incremental == 0) && (0 < this->verbosity)) {
    puts(
        "c ========================================[ MAGIC CONSTANTS ]=============================================="
        );
    puts(
        "c | Constants are supposed to work well together :-)                                                      |"
        );
    puts(
        "c | however, if you find better choices, please let us known...                                           |"
        );
    puts(
        "c |-------------------------------------------------------------------------------------------------------|"
        );
    puts(
        "c |                                |                                |                                     |"
        );
    puts(
        "c | - Restarts:                    | - Reduce Clause DB:            | - Minimize Asserting:               |"
        );
    printf("c |   * LBD Queue    : %6d      |   * First     : %6d         |    * size < %3d                     |\n"
           ,(ulong)(uint)(this->lbdQueue).maxsize,(ulong)(uint)this->nbclausesbeforereduce,
           (ulong)(uint)this->lbSizeMinimizingClause);
    printf("c |   * Trail  Queue : %6d      |   * Inc       : %6d         |    * lbd  < %3d                     |\n"
           ,(ulong)(uint)(this->trailQueue).maxsize,(ulong)(uint)this->incReduceDB);
    printf("c |   * K            : %6.2f      |   * Special   : %6d         |                                     |\n"
           ,this->K,(ulong)(uint)this->specialIncReduceDB);
    printf("c |   * R            : %6.2f      |   * Protected :  (lbd)< %2d     |                                     |\n"
           ,this->R,(ulong)this->lbLBDFrozenClause);
    puts(
        "c |                                |                                |                                     |"
        );
    __usage = (rusage *)(ulong)(uint)this->verbEveryConflicts;
    printf(
          "c ==================================[ Search Statistics (every %6d conflicts) ]=========================\n"
          );
    puts(
        "c |                                                                                                       |"
        );
    puts(
        "c |          RESTARTS           |          ORIGINAL         |              LEARNT              | Progress |"
        );
    puts(
        "c |       NB   Blocked  Avg Cfc |    Vars  Clauses Literals |   Red   Learnts    LBD2  Removed |          |"
        );
    puts(
        "c ========================================================================================================="
        );
  }
  lVar3 = search(this,(int)__usage);
  if (this->asynch_interrupt == false) {
    while (((((this->conflict_budget < 0 || ((ulong)this->conflicts < (ulong)this->conflict_budget))
             && ((this->propagation_budget < 0 ||
                 ((ulong)this->propagations < (ulong)this->propagation_budget)))) &&
            (this->terminate_search_early == false)) &&
           ((this->pstop == (int *)0x0 || (*this->pstop == 0))))) {
      if (this->nRuntimeLimit != 0) {
        __usage = &local_b8;
        iVar4 = clock_gettime(3,(timespec *)&local_b8);
        if (iVar4 < 0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = local_b8.ru_utime.tv_usec / 1000 + local_b8.ru_utime.tv_sec * 1000000;
        }
        if (this->nRuntimeLimit < uVar8) break;
      }
      if (((lVar3.value & 2) == 0) ||
         (lVar3 = search(this,(int)__usage), this->asynch_interrupt == true)) break;
    }
  }
  if ((this->incremental == 0) && (0 < this->verbosity)) {
    puts(
        "c ========================================================================================================="
        );
  }
  if (this->certifiedUNSAT == true) {
    if (lVar3.value == 1) {
      fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
    }
    fclose((FILE *)this->certifiedOutput);
  }
  if (lVar3.value == 0) {
    vec<Gluco::lbool>::growTo(&this->model,(this->vardata).sz);
    if (0 < (this->vardata).sz) {
      lVar5 = 0;
      do {
        (this->model).data[lVar5].value = (this->assigns).data[lVar5].value;
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->vardata).sz);
    }
  }
  else if ((lVar3.value == 1) && ((this->conflict).sz == 0)) {
    this->ok = false;
  }
  cancelUntil(this,0);
  getrusage(RUSAGE_SELF,&local_b8);
  if (lVar3.value == 0) {
    this->nbSatCalls = this->nbSatCalls + 1;
    iVar4 = -1;
    lVar5 = 0x480;
  }
  else {
    iVar4 = -1;
    if (lVar3.value != 1) goto LAB_005c40b0;
    this->nbUnsatCalls = this->nbUnsatCalls + 1;
    iVar4 = 0;
    lVar5 = 0x488;
  }
  *(double *)((long)&this->_vptr_Solver + lVar5) =
       (((double)local_b8.ru_utime.tv_usec / 1000000.0 + (double)local_b8.ru_utime.tv_sec) -
       (dVar10 / 1000000.0 + dVar9)) + *(double *)((long)&this->_vptr_Solver + lVar5);
LAB_005c40b0:
  p_Var1 = this->pCnfFunc;
  if (p_Var1 != (_func_int_void_ptr_int_int_ptr *)0x0) {
    if (this->terminate_search_early == false) {
      if (lVar3.value == 0) {
        lVar5 = (long)(this->vardata).sz;
        uVar8 = 0xffffffffffffffff;
        if (-1 < lVar5) {
          uVar8 = lVar5 * 4;
        }
        piVar6 = (int *)operator_new__(uVar8);
        iVar4 = 1;
        if (0 < lVar5) {
          plVar2 = (this->model).data;
          lVar7 = 0;
          do {
            piVar6[lVar7] = (uint)(plVar2[lVar7].value == '\0');
            lVar7 = lVar7 + 1;
          } while (lVar5 != lVar7);
        }
      }
      else {
        piVar6 = (int *)0x0;
      }
      iVar4 = (*p_Var1)(this->pCnfMan,iVar4,piVar6);
      if (iVar4 != 0) {
        __assert_fail("callback_result == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x511,"lbool Gluco::Solver::solve_()");
      }
    }
    else {
      this->terminate_search_early = false;
    }
  }
  return (lbool)lVar3.value;
}

Assistant:

lbool Solver::solve_()
{

  if(incremental && certifiedUNSAT) {
    printf("Can not use incremental and certified unsat in the same time\n");
    exit(-1);
  }
    model.clear();
    conflict.clear();
    if (!ok) return l_False;
    double curTime = cpuTime();

    
    solves++;
            

    
    lbool   status        = l_Undef;
    if(!incremental && verbosity>=1) {
      printf("c ========================================[ MAGIC CONSTANTS ]==============================================\n");
      printf("c | Constants are supposed to work well together :-)                                                      |\n");
      printf("c | however, if you find better choices, please let us known...                                           |\n");
      printf("c |-------------------------------------------------------------------------------------------------------|\n");
    printf("c |                                |                                |                                     |\n"); 
    printf("c | - Restarts:                    | - Reduce Clause DB:            | - Minimize Asserting:               |\n");
    printf("c |   * LBD Queue    : %6d      |   * First     : %6d         |    * size < %3d                     |\n",lbdQueue.maxSize(),nbclausesbeforereduce,lbSizeMinimizingClause);
    printf("c |   * Trail  Queue : %6d      |   * Inc       : %6d         |    * lbd  < %3d                     |\n",trailQueue.maxSize(),incReduceDB,lbLBDMinimizingClause);
    printf("c |   * K            : %6.2f      |   * Special   : %6d         |                                     |\n",K,specialIncReduceDB);
    printf("c |   * R            : %6.2f      |   * Protected :  (lbd)< %2d     |                                     |\n",R,lbLBDFrozenClause);
    printf("c |                                |                                |                                     |\n"); 
printf("c ==================================[ Search Statistics (every %6d conflicts) ]=========================\n",verbEveryConflicts);
      printf("c |                                                                                                       |\n"); 

      printf("c |          RESTARTS           |          ORIGINAL         |              LEARNT              | Progress |\n");
      printf("c |       NB   Blocked  Avg Cfc |    Vars  Clauses Literals |   Red   Learnts    LBD2  Removed |          |\n");
      printf("c =========================================================================================================\n");
    }

    // Search:
    int curr_restarts = 0;
    while (status == l_Undef){
      status = search(0); // the parameter is useless in glucose, kept to allow modifications
        if (!withinBudget() || terminate_search_early || (pstop && *pstop)) break;
        if (nRuntimeLimit && Abc_Clock() > nRuntimeLimit)                   break;
        curr_restarts++;
    }

    if (!incremental && verbosity >= 1)
      printf("c =========================================================================================================\n");


    if (certifiedUNSAT){ // Want certified output
      if (status == l_False)
        fprintf(certifiedOutput, "0\n");
      fclose(certifiedOutput);
    }


    if (status == l_True){
        // Extend & copy model:
        model.growTo(nVars());
        for (int i = 0; i < nVars(); i++) model[i] = value(i);
    }else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);

    double finalTime = cpuTime();
    if(status==l_True) {
      nbSatCalls++; 
      totalTime4Sat +=(finalTime-curTime);
    }
    if(status==l_False) {
      nbUnsatCalls++; 
      totalTime4Unsat +=(finalTime-curTime);
    }

    // ABC callback
    if (pCnfFunc && !terminate_search_early) {// hack to avoid calling callback twise if the solver was terminated early
        int * pCex = NULL;
        int message = (status == l_True ? 1 : status == l_False ? 0 : -1);
        if (status == l_True) {
            pCex = new int[nVars()];
            for (int i = 0; i < nVars(); i++)
                pCex[i] = (model[i] == l_True);
        }
        
        int callback_result = pCnfFunc(pCnfMan, message, pCex);
        assert(callback_result == 0);
    }
    else if (pCnfFunc)
        terminate_search_early = false; // for next run

    return status;
}